

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateBuilder
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  undefined1 local_b8 [8];
  MessageBuilderLiteGenerator builderGenerator;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageLiteGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_38,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "public static Builder newBuilder() {\n  return (Builder) DEFAULT_INSTANCE.createBuilder();\n}\npublic static Builder newBuilder($classname$ prototype) {\n  return (Builder) DEFAULT_INSTANCE.createBuilder(prototype);\n}\n\n"
             ,(char (*) [10])0x77c586,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  MessageBuilderLiteGenerator::MessageBuilderLiteGenerator
            ((MessageBuilderLiteGenerator *)local_b8,(this->super_MessageGenerator).descriptor_,
             this->context_);
  MessageBuilderLiteGenerator::Generate((MessageBuilderLiteGenerator *)local_b8,local_18);
  MessageBuilderLiteGenerator::~MessageBuilderLiteGenerator((MessageBuilderLiteGenerator *)local_b8)
  ;
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateBuilder(io::Printer* printer) {
  printer->Print(
      "public static Builder newBuilder() {\n"
      "  return (Builder) DEFAULT_INSTANCE.createBuilder();\n"
      "}\n"
      "public static Builder newBuilder($classname$ prototype) {\n"
      "  return (Builder) DEFAULT_INSTANCE.createBuilder(prototype);\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  MessageBuilderLiteGenerator builderGenerator(descriptor_, context_);
  builderGenerator.Generate(printer);
}